

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_channel_converter_init_preallocated
                    (ma_channel_converter_config *pConfig,void *pHeap,
                    ma_channel_converter *pConverter)

{
  ma_format mVar1;
  ma_channel *pmVar2;
  float *pfVar3;
  ma_channel mVar4;
  ma_channel mVar5;
  ma_result mVar6;
  ma_channel_conversion_path mVar7;
  ma_bool32 mVar8;
  ma_uint8 *pmVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ma_uint32 mVar13;
  ma_uint32 spatialChannelCount;
  uint uVar14;
  ma_uint32 mVar15;
  ma_uint32 iChannel;
  float **ppfVar16;
  float fVar17;
  ma_uint32 iChannelOutLFE;
  void *local_78;
  ma_channel_converter_config *local_70;
  ma_channel *local_68;
  ulong local_60;
  ma_channel_converter_heap_layout heapLayout;
  
  if (pConverter == (ma_channel_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  pConverter->weights = (anon_union_8_2_43a84514_for_weights)0x0;
  pConverter->_pHeap = (void *)0x0;
  pConverter->pChannelMapOut = (ma_channel *)0x0;
  pConverter->pShuffleTable = (ma_uint8 *)0x0;
  pConverter->conversionPath = ma_channel_conversion_path_unknown;
  *(undefined4 *)&pConverter->field_0x14 = 0;
  pConverter->pChannelMapIn = (ma_channel *)0x0;
  pConverter->format = ma_format_unknown;
  pConverter->channelsIn = 0;
  pConverter->channelsOut = 0;
  pConverter->mixingMode = ma_channel_mix_mode_default;
  *(undefined8 *)&pConverter->_ownsHeap = 0;
  mVar6 = ma_channel_converter_get_heap_layout(pConfig,&heapLayout);
  if (mVar6 != MA_SUCCESS) {
    return mVar6;
  }
  pConverter->_pHeap = pHeap;
  if (heapLayout.sizeInBytes != 0 && pHeap != (void *)0x0) {
    memset(pHeap,0,heapLayout.sizeInBytes);
  }
  pConverter->format = pConfig->format;
  uVar11._0_4_ = pConfig->channelsIn;
  uVar11._4_4_ = pConfig->channelsOut;
  pConverter->channelsIn = (undefined4)uVar11;
  pConverter->channelsOut = uVar11._4_4_;
  pConverter->mixingMode = pConfig->mixingMode;
  pmVar2 = pConfig->pChannelMapIn;
  if (pmVar2 == (ma_channel *)0x0) {
    pConverter->pChannelMapIn = (ma_channel *)0x0;
  }
  else {
    pConverter->pChannelMapIn = (ma_channel *)(heapLayout.channelMapInOffset + (long)pHeap);
    ma_channel_map_copy_or_default
              ((ma_channel *)(heapLayout.channelMapInOffset + (long)pHeap),uVar11 & 0xffffffff,
               pmVar2,(undefined4)uVar11);
  }
  pmVar2 = pConfig->pChannelMapOut;
  if (pmVar2 == (ma_channel *)0x0) {
    pConverter->pChannelMapOut = (ma_channel *)0x0;
  }
  else {
    pConverter->pChannelMapOut = (ma_channel *)(heapLayout.channelMapOutOffset + (long)pHeap);
    ma_channel_map_copy_or_default
              ((ma_channel *)(heapLayout.channelMapOutOffset + (long)pHeap),
               (ulong)pConfig->channelsOut,pmVar2,pConfig->channelsOut);
  }
  mVar7 = ma_channel_converter_config_get_conversion_path(pConfig);
  pConverter->conversionPath = mVar7;
  if (mVar7 == ma_channel_conversion_path_shuffle) {
    pmVar9 = (ma_uint8 *)(heapLayout.shuffleTableOffset + (long)pHeap);
    pConverter->pShuffleTable = pmVar9;
    mVar13 = pConverter->channelsIn;
    local_60 = (ulong)pConverter->channelsOut;
    if ((mVar13 == 0 || pHeap == (void *)0x0) || local_60 == 0) {
      return MA_SUCCESS;
    }
    pmVar2 = pConverter->pChannelMapIn;
    local_68 = pConverter->pChannelMapOut;
    local_78 = pHeap;
    local_70 = pConfig;
    for (uVar11 = 0; uVar11 != local_60; uVar11 = uVar11 + 1) {
      pmVar9[uVar11] = 0xff;
      mVar4 = ma_channel_map_get_channel(local_68,(ma_uint32)local_60,(ma_uint32)uVar11);
      for (mVar15 = 0; mVar13 != mVar15; mVar15 = mVar15 + 1) {
        mVar5 = ma_channel_map_get_channel(pmVar2,mVar13,mVar15);
        if (mVar4 == mVar5) {
          pmVar9[uVar11] = (ma_uint8)mVar15;
          break;
        }
        if (mVar4 == '\x02') {
LAB_00144121:
          if ((mVar5 == '\x02') || (mVar5 == '\v')) {
LAB_00144135:
            pmVar9[uVar11] = (ma_uint8)mVar15;
          }
        }
        else if ((mVar4 == '\x03') || (mVar4 == '\f')) {
          if ((mVar5 == '\x03') || (mVar5 == '\f')) goto LAB_00144135;
        }
        else if (mVar4 == '\v') goto LAB_00144121;
      }
    }
    mVar7 = pConverter->conversionPath;
    pConfig = local_70;
    pHeap = local_78;
  }
  if (mVar7 == ma_channel_conversion_path_weights) {
    mVar1 = pConverter->format;
    ppfVar16 = (float **)((long)pHeap + heapLayout.weightsOffset);
    uVar11 = (ulong)pConverter->channelsIn;
    (pConverter->weights).f32 = ppfVar16;
    lVar12 = 0;
    if (mVar1 == ma_format_f32) {
      for (; uVar11 * 4 - lVar12 != 0; lVar12 = lVar12 + 4) {
        *(ulong *)((long)(pConverter->weights).f32 + lVar12 * 2) =
             (long)ppfVar16 + (ulong)pConverter->channelsOut * lVar12 + uVar11 * 8;
      }
    }
    else {
      for (; uVar11 * 4 - lVar12 != 0; lVar12 = lVar12 + 4) {
        *(ulong *)((long)(pConverter->weights).f32 + lVar12 * 2) =
             (long)ppfVar16 + (ulong)pConverter->channelsOut * lVar12 + uVar11 * 8;
      }
    }
    for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 1) {
      for (uVar11 = 0; uVar11 < pConverter->channelsOut; uVar11 = uVar11 + 1) {
        (pConverter->weights).f32[uVar10][uVar11] = 0.0;
      }
      uVar11 = (ulong)pConverter->channelsIn;
    }
    for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 1) {
      mVar4 = ma_channel_map_get_channel
                        (pConverter->pChannelMapIn,(ma_uint32)uVar11,(ma_uint32)uVar10);
      for (uVar11 = 0; uVar11 < pConverter->channelsOut; uVar11 = uVar11 + 1) {
        mVar5 = ma_channel_map_get_channel
                          (pConverter->pChannelMapOut,pConverter->channelsOut,(ma_uint32)uVar11);
        if (mVar4 == mVar5) {
          if (mVar1 == ma_format_f32) {
            (pConverter->weights).f32[uVar10][uVar11] = 1.0;
          }
          else {
            (pConverter->weights).f32[uVar10][uVar11] = 5.73972e-42;
          }
        }
      }
      uVar11 = (ulong)pConverter->channelsIn;
    }
    if (pConverter->mixingMode != ma_channel_mix_mode_simple) {
      if (pConverter->mixingMode == ma_channel_mix_mode_custom_weights) {
        ppfVar16 = pConfig->ppWeights;
        if (ppfVar16 != (float **)0x0) {
          for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 1) {
            for (uVar11 = 0; uVar11 < pConverter->channelsOut; uVar11 = uVar11 + 1) {
              fVar17 = ppfVar16[uVar10][uVar11];
              if (mVar1 == ma_format_f32) {
                (pConverter->weights).f32[uVar10][uVar11] = fVar17;
              }
              else {
                (pConverter->weights).f32[uVar10][uVar11] = (float)(int)(fVar17 * 4096.0);
              }
            }
            uVar11 = (ulong)pConverter->channelsIn;
          }
          return MA_SUCCESS;
        }
        return MA_INVALID_ARGS;
      }
      for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 1) {
        mVar4 = ma_channel_map_get_channel
                          (pConverter->pChannelMapIn,(ma_uint32)uVar11,(ma_uint32)uVar10);
        mVar8 = ma_is_spatial_channel_position(mVar4);
        if ((mVar8 != 0) &&
           (mVar8 = ma_channel_map_contains_channel_position
                              (pConverter->channelsOut,pConverter->pChannelMapOut,mVar4), mVar8 == 0
           )) {
          for (uVar11 = 0; uVar11 < pConverter->channelsOut; uVar11 = uVar11 + 1) {
            mVar5 = ma_channel_map_get_channel
                              (pConverter->pChannelMapOut,pConverter->channelsOut,(ma_uint32)uVar11)
            ;
            mVar8 = ma_is_spatial_channel_position(mVar5);
            if (mVar8 != 0) {
              fVar17 = 0.0;
              if (pConverter->mixingMode == ma_channel_mix_mode_default) {
                fVar17 = ma_calculate_channel_position_rectangular_weight(mVar4,mVar5);
              }
              pfVar3 = (pConverter->weights).f32[uVar10];
              if (pConverter->format == ma_format_f32) {
                if ((pfVar3[uVar11] == 0.0) && (!NAN(pfVar3[uVar11]))) {
                  pfVar3[uVar11] = fVar17;
                }
              }
              else if (pfVar3[uVar11] == 0.0) {
                pfVar3[uVar11] = (float)(int)(fVar17 * 4096.0);
              }
            }
          }
        }
        uVar11 = (ulong)pConverter->channelsIn;
      }
      for (uVar11 = 0; uVar11 < pConverter->channelsOut; uVar11 = uVar11 + 1) {
        mVar4 = ma_channel_map_get_channel
                          (pConverter->pChannelMapOut,pConverter->channelsOut,(ma_uint32)uVar11);
        mVar8 = ma_is_spatial_channel_position(mVar4);
        if ((mVar8 != 0) &&
           (mVar8 = ma_channel_map_contains_channel_position
                              (pConverter->channelsIn,pConverter->pChannelMapIn,mVar4), mVar8 == 0))
        {
          for (uVar10 = 0; uVar10 < pConverter->channelsIn; uVar10 = uVar10 + 1) {
            mVar5 = ma_channel_map_get_channel
                              (pConverter->pChannelMapIn,pConverter->channelsIn,(ma_uint32)uVar10);
            mVar8 = ma_is_spatial_channel_position(mVar5);
            if (mVar8 != 0) {
              fVar17 = 0.0;
              if (pConverter->mixingMode == ma_channel_mix_mode_default) {
                fVar17 = ma_calculate_channel_position_rectangular_weight(mVar5,mVar4);
              }
              pfVar3 = (pConverter->weights).f32[uVar10];
              if (pConverter->format == ma_format_f32) {
                if ((pfVar3[uVar11] == 0.0) && (!NAN(pfVar3[uVar11]))) {
                  pfVar3[uVar11] = fVar17;
                }
              }
              else if (pfVar3[uVar11] == 0.0) {
                pfVar3[uVar11] = (float)(int)(fVar17 * 4096.0);
              }
            }
          }
        }
      }
      if (pConfig->calculateLFEFromSpatialChannels == 0) {
        return MA_SUCCESS;
      }
      mVar8 = ma_channel_map_contains_channel_position
                        (pConverter->channelsIn,pConverter->pChannelMapIn,'\x05');
      if (mVar8 != 0) {
        return MA_SUCCESS;
      }
      pmVar2 = pConverter->pChannelMapIn;
      mVar13 = pConverter->channelsIn;
      uVar14 = 0;
      for (mVar15 = 0; mVar13 != mVar15; mVar15 = mVar15 + 1) {
        mVar4 = ma_channel_map_get_channel(pmVar2,mVar13,mVar15);
        mVar8 = ma_is_spatial_channel_position(mVar4);
        uVar14 = uVar14 + mVar8;
      }
      if ((uVar14 != 0) &&
         (mVar8 = ma_channel_map_find_channel_position
                            (pConverter->channelsOut,pConverter->pChannelMapOut,'\x05',
                             &iChannelOutLFE), mVar8 != 0)) {
        for (uVar11 = 0; uVar11 < mVar13; uVar11 = uVar11 + 1) {
          mVar4 = ma_channel_map_get_channel(pmVar2,mVar13,(ma_uint32)uVar11);
          mVar8 = ma_is_spatial_channel_position(mVar4);
          if (mVar8 != 0) {
            pfVar3 = (pConverter->weights).f32[uVar11];
            uVar10 = (ulong)iChannelOutLFE;
            if (pConverter->format == ma_format_f32) {
              if ((pfVar3[uVar10] == 0.0) && (!NAN(pfVar3[uVar10]))) {
                pfVar3[uVar10] = 1.0 / (float)uVar14;
              }
            }
            else if (pfVar3[uVar10] == 0.0) {
              pfVar3[uVar10] = (float)(int)((1.0 / (float)uVar14) * 4096.0);
              mVar13 = pConverter->channelsIn;
            }
          }
        }
      }
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_channel_converter_init_preallocated(const ma_channel_converter_config* pConfig, void* pHeap, ma_channel_converter* pConverter)
{
    ma_result result;
    ma_channel_converter_heap_layout heapLayout;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pConverter);

    result = ma_channel_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pConverter->_pHeap = pHeap;
    MA_ZERO_MEMORY(pConverter->_pHeap, heapLayout.sizeInBytes);

    pConverter->format      = pConfig->format;
    pConverter->channelsIn  = pConfig->channelsIn;
    pConverter->channelsOut = pConfig->channelsOut;
    pConverter->mixingMode  = pConfig->mixingMode;

    if (pConfig->pChannelMapIn != NULL) {
        pConverter->pChannelMapIn = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapInOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapIn, pConfig->channelsIn, pConfig->pChannelMapIn, pConfig->channelsIn);
    } else {
        pConverter->pChannelMapIn = NULL;   /* Use default channel map. */
    }

    if (pConfig->pChannelMapOut != NULL) {
        pConverter->pChannelMapOut = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapOutOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapOut, pConfig->channelsOut, pConfig->pChannelMapOut, pConfig->channelsOut);
    } else {
        pConverter->pChannelMapOut = NULL;  /* Use default channel map. */
    }

    pConverter->conversionPath = ma_channel_converter_config_get_conversion_path(pConfig);

    if (pConverter->conversionPath == ma_channel_conversion_path_shuffle) {
        pConverter->pShuffleTable = (ma_uint8*)ma_offset_ptr(pHeap, heapLayout.shuffleTableOffset);
        ma_channel_map_build_shuffle_table(pConverter->pChannelMapIn, pConverter->channelsIn, pConverter->pChannelMapOut, pConverter->channelsOut, pConverter->pShuffleTable);
    }

    if (pConverter->conversionPath == ma_channel_conversion_path_weights) {
        ma_uint32 iChannelIn;
        ma_uint32 iChannelOut;

        if (pConverter->format == ma_format_f32) {
            pConverter->weights.f32 = (float**   )ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.f32[iChannelIn] = (float*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(float*) * pConverter->channelsIn) + (sizeof(float) * pConverter->channelsOut * iChannelIn)));
            }
        } else {
            pConverter->weights.s16 = (ma_int32**)ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.s16[iChannelIn] = (ma_int32*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(ma_int32*) * pConverter->channelsIn) + (sizeof(ma_int32) * pConverter->channelsOut * iChannelIn)));
            }
        }

        /* Silence our weights by default. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                if (pConverter->format == ma_format_f32) {
                    pConverter->weights.f32[iChannelIn][iChannelOut] = 0.0f;
                } else {
                    pConverter->weights.s16[iChannelIn][iChannelOut] = 0;
                }
            }
        }

        /*
        We now need to fill out our weights table. This is determined by the mixing mode.
        */

        /* In all cases we need to make sure all channels that are present in both channel maps have a 1:1 mapping. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
            ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                if (channelPosIn == channelPosOut) {
                    float weight = 1;

                    if (pConverter->format == ma_format_f32) {
                        pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                    } else {
                        pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                    }
                }
            }
        }

        switch (pConverter->mixingMode)
        {
            case ma_channel_mix_mode_custom_weights:
            {
                if (pConfig->ppWeights == NULL) {
                    return MA_INVALID_ARGS; /* Config specified a custom weights mixing mode, but no custom weights have been specified. */
                }

                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                    for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                        float weight = pConfig->ppWeights[iChannelIn][iChannelOut];

                        if (pConverter->format == ma_format_f32) {
                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                        } else {
                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                        }
                    }
                }
            } break;

            case ma_channel_mix_mode_simple:
            {
                /*
                In simple mode, only set weights for channels that have exactly matching types, leave the rest at
                zero. The 1:1 mappings have already been covered before this switch statement.
                */
            } break;

            case ma_channel_mix_mode_rectangular:
            default:
            {
                /* Unmapped input channels. */
                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                    ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                    if (ma_is_spatial_channel_position(channelPosIn)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, channelPosIn)) {
                            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                                if (ma_is_spatial_channel_position(channelPosOut)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* Unmapped output channels. */
                for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                    ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                    if (ma_is_spatial_channel_position(channelPosOut)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, channelPosOut)) {
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* If LFE is in the output channel map but was not present in the input channel map, configure its weight now */
                if (pConfig->calculateLFEFromSpatialChannels) {
                    if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, MA_CHANNEL_LFE)) {
                        ma_uint32 spatialChannelCount = ma_channel_map_get_spatial_channel_count(pConverter->pChannelMapIn, pConverter->channelsIn);
                        ma_uint32 iChannelOutLFE;

                        if (spatialChannelCount > 0 && ma_channel_map_find_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, MA_CHANNEL_LFE, &iChannelOutLFE)) {
                            const float weightForLFE = 1.0f / spatialChannelCount;
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                const ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);
                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOutLFE] = weightForLFE;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOutLFE] = ma_channel_converter_float_to_fixed(weightForLFE);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            } break;
        }
    }

    return MA_SUCCESS;
}